

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_vtab_in(sqlite3_index_info *pIdxInfo,int iCons,int bHandle)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 1 << ((byte)iCons & 0x1f);
  iVar1 = 0;
  if (0x1f < iCons) {
    uVar2 = 0;
  }
  if ((*(uint *)&pIdxInfo[1].field_0x14 & uVar2) != 0) {
    if (bHandle == 0) {
      *(uint *)&pIdxInfo[1].aOrderBy = *(uint *)&pIdxInfo[1].aOrderBy & ~uVar2;
      return 1;
    }
    iVar1 = 1;
    if (0 < bHandle) {
      *(uint *)&pIdxInfo[1].aOrderBy = *(uint *)&pIdxInfo[1].aOrderBy | uVar2;
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_vtab_in(sqlite3_index_info *pIdxInfo, int iCons, int bHandle){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  u32 m = SMASKBIT32(iCons);
  if( m & pHidden->mIn ){
    if( bHandle==0 ){
      pHidden->mHandleIn &= ~m;
    }else if( bHandle>0 ){
      pHidden->mHandleIn |= m;
    }
    return 1;
  }
  return 0;
}